

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDeadline.h
# Opt level: O0

void __thiscall EDeadline::EDeadline(EDeadline *this,string *arg,double expectedTimeForCompletion)

{
  string *in_RSI;
  string *in_RDI;
  size_type in_XMM0_Qa;
  E *this_00;
  E local_38;
  
  this_00 = &local_38;
  local_38._m_error.field_2._8_8_ = in_XMM0_Qa;
  std::__cxx11::string::string((string *)this_00,in_RSI);
  E::E(this_00,in_RDI);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)in_RDI = &PTR__EDeadline_00d01f98;
  in_RDI[1]._M_string_length = local_38._m_error.field_2._8_8_;
  return;
}

Assistant:

EDeadline(std::string arg, double expectedTimeForCompletion=0):
        E(arg),
        _m_expectedTimeForCompletion(expectedTimeForCompletion)
        {}